

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_motion.c
# Opt level: O2

int64_t av1_segmented_frame_error
                  (int use_hbd,int bd,uint8_t *ref,int ref_stride,uint8_t *dst,int dst_stride,
                  int p_width,int p_height,uint8_t *segment_map,int segment_map_stride)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  int64_t iVar4;
  uint16_t *puVar5;
  uint16_t *dst_00;
  uint16_t *puVar6;
  int iVar7;
  int iVar8;
  uint16_t *puVar9;
  uint16_t *ref_00;
  long lVar10;
  uint16_t *puVar11;
  int iVar12;
  uint16_t *puVar13;
  uint16_t *puVar14;
  int j_1;
  uint8_t *puVar15;
  int j;
  long lVar16;
  
  if (use_hbd == 0) {
    iVar4 = 0;
    for (lVar10 = 0; lVar10 < p_height; lVar10 = lVar10 + 0x20) {
      iVar12 = p_height - (int)lVar10;
      if (p_height < iVar12) {
        iVar12 = p_height;
      }
      iVar8 = 0x20;
      if (iVar12 < 0x20) {
        iVar8 = iVar12;
      }
      puVar15 = segment_map;
      iVar7 = p_width;
      for (lVar16 = 0; lVar16 < p_width; lVar16 = lVar16 + 0x20) {
        if (*puVar15 != '\0') {
          iVar2 = iVar7;
          if (p_width < iVar7) {
            iVar2 = p_width;
          }
          if (iVar2 < 0x20 || iVar12 < 0x20) {
            if (0x1f < iVar2) {
              iVar2 = 0x20;
            }
            iVar2 = generic_sad(ref + lVar16,ref_stride,dst + lVar16,dst_stride,iVar2,iVar8);
            uVar3 = (ulong)iVar2;
          }
          else {
            uVar1 = (*aom_sad32x32)(ref + lVar16,ref_stride,dst + lVar16,dst_stride);
            uVar3 = (ulong)uVar1;
          }
          iVar4 = iVar4 + uVar3;
        }
        iVar7 = iVar7 + -0x20;
        puVar15 = puVar15 + 1;
      }
      dst = dst + (long)dst_stride * 0x20;
      ref = ref + (long)ref_stride * 0x20;
      segment_map = segment_map + segment_map_stride;
    }
  }
  else {
    puVar5 = (uint16_t *)((long)ref * 2);
    puVar11 = (uint16_t *)((long)dst * 2);
    iVar4 = 0;
    puVar6 = puVar5;
    puVar14 = puVar11;
    for (lVar10 = 0; lVar10 < p_height; lVar10 = lVar10 + 0x20) {
      iVar12 = p_height - (int)lVar10;
      if (p_height < iVar12) {
        iVar12 = p_height;
      }
      iVar8 = 0x20;
      if (iVar12 < 0x20) {
        iVar8 = iVar12;
      }
      dst_00 = puVar11;
      puVar9 = puVar6;
      ref_00 = puVar5;
      puVar13 = puVar14;
      puVar15 = segment_map;
      iVar7 = p_width;
      for (lVar16 = 0; lVar16 < p_width; lVar16 = lVar16 + 0x20) {
        if (*puVar15 != '\0') {
          iVar2 = iVar7;
          if (p_width < iVar7) {
            iVar2 = p_width;
          }
          if (iVar2 < 0x20 || iVar12 < 0x20) {
            if (0x1f < iVar2) {
              iVar2 = 0x20;
            }
            iVar2 = generic_sad_highbd(ref_00,ref_stride,dst_00,dst_stride,iVar2,iVar8);
            uVar3 = (ulong)iVar2;
          }
          else {
            uVar1 = (*aom_highbd_sad32x32)
                              ((uint8_t *)((ulong)puVar9 >> 1),ref_stride,
                               (uint8_t *)((ulong)puVar13 >> 1),dst_stride);
            uVar3 = (ulong)uVar1;
          }
          iVar4 = iVar4 + uVar3;
        }
        puVar13 = puVar13 + 0x20;
        dst_00 = dst_00 + 0x20;
        puVar9 = puVar9 + 0x20;
        ref_00 = ref_00 + 0x20;
        iVar7 = iVar7 + -0x20;
        puVar15 = puVar15 + 1;
      }
      puVar14 = puVar14 + (long)dst_stride * 0x20;
      puVar11 = puVar11 + (long)dst_stride * 0x20;
      puVar6 = puVar6 + (long)ref_stride * 0x20;
      puVar5 = puVar5 + (long)ref_stride * 0x20;
      segment_map = segment_map + segment_map_stride;
    }
  }
  return iVar4;
}

Assistant:

int64_t av1_segmented_frame_error(int use_hbd, int bd, const uint8_t *ref,
                                  int ref_stride, uint8_t *dst, int dst_stride,
                                  int p_width, int p_height,
                                  uint8_t *segment_map,
                                  int segment_map_stride) {
#if CONFIG_AV1_HIGHBITDEPTH
  if (use_hbd) {
    return highbd_segmented_frame_error(
        CONVERT_TO_SHORTPTR(ref), ref_stride, CONVERT_TO_SHORTPTR(dst),
        dst_stride, p_width, p_height, bd, segment_map, segment_map_stride);
  }
#endif
  (void)use_hbd;
  (void)bd;
  return segmented_frame_error(ref, ref_stride, dst, dst_stride, p_width,
                               p_height, segment_map, segment_map_stride);
}